

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O1

void __thiscall CHud::RenderLocalTime(CHud *this,float x)

{
  CGameClient *pCVar1;
  ITextRender *pIVar2;
  bool bVar3;
  int iVar4;
  long in_FS_OFFSET;
  char aTimeStr [6];
  vec4 local_48;
  CUIRect local_38;
  char local_26 [4];
  char local_22;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = (this->super_CComponent).m_pClient;
  if (pCVar1->m_pConfig->m_ClShowLocalTimeAlways == 0) {
    bVar3 = CScoreboard::IsActive(pCVar1->m_pScoreboard);
    if (!bVar3) goto LAB_00148d1c;
  }
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
  local_38.x = x + -30.0;
  local_38.y = 0.0;
  local_38.w = 25.0;
  local_38.h = 12.5;
  local_48.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x0;
  local_48.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x0;
  local_48.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x0;
  local_48.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3ecccccd;
  CUIRect::Draw(&local_38,&local_48,3.75,0xc);
  str_timestamp_format(local_26,6,"%H:%M");
  if (RenderLocalTime(float)::s_Cursor == '\0') {
    iVar4 = __cxa_guard_acquire(&RenderLocalTime(float)::s_Cursor);
    if (iVar4 != 0) {
      CTextCursor::CTextCursor(&RenderLocalTime::s_Cursor,5.0,0);
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderLocalTime::s_Cursor,&__dso_handle);
      __cxa_guard_release(&RenderLocalTime(float)::s_Cursor);
    }
  }
  RenderLocalTime::s_Cursor.m_Align = 1;
  CTextCursor::Reset(&RenderLocalTime::s_Cursor,(long)local_22);
  RenderLocalTime::s_Cursor.m_CursorPos.field_0.x = local_38.w * 0.5 + local_38.x;
  RenderLocalTime::s_Cursor.m_CursorPos.field_1.y = 2.5;
  pIVar2 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar2->super_IInterface)._vptr_IInterface[0xb])
            (pIVar2,&RenderLocalTime::s_Cursor,local_26,0xffffffff);
LAB_00148d1c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderLocalTime(float x)
{
	if(!Config()->m_ClShowLocalTimeAlways && !m_pClient->m_pScoreboard->IsActive())
		return;

	//draw the box
	Graphics()->BlendNormal();
	CUIRect Rect = {x-30.0f, 0.0f, 25.0f, 12.5f};
	vec4 Color = vec4(0.0f, 0.0f, 0.0f, 0.4f);
	Rect.Draw(Color, 3.75f, CUIRect::CORNER_B);

	//draw the text
	char aTimeStr[6];
	str_timestamp_format(aTimeStr, sizeof(aTimeStr), "%H:%M");
	static CTextCursor s_Cursor(5.0f);
	s_Cursor.m_Align = TEXTALIGN_CENTER;
	s_Cursor.Reset(aTimeStr[4]); // last digit always indicate changes
	s_Cursor.MoveTo(Rect.x + Rect.w / 2, (12.5f - 7.5f) / 2.f);
	TextRender()->TextOutlined(&s_Cursor, aTimeStr, -1);
}